

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  int *y;
  ulong uVar1;
  int k_1;
  int k;
  long lVar2;
  int k_2;
  long lVar3;
  int j;
  long lVar4;
  Mat *pMVar5;
  double dVar6;
  Mat p;
  Mat sol;
  ArrayZZ sum_invRp;
  Scal pSum;
  Matrix<double,__1,__1,_0,__1,__1> local_118;
  undefined1 local_100 [24];
  Matrix<double,__1,__1,_0,__1,__1> *local_e8;
  variable_if_dynamic<long,__1> local_e0;
  variable_if_dynamic<long,__1> local_d8;
  Mat *local_d0;
  Mat *local_c8;
  Matrix<double,__1,__1,_0,__1,__1> *local_c0;
  Matrix<double,__1,__1,_0,__1,__1> local_b8;
  ulong local_a0;
  Mat *local_98;
  int *local_90;
  double **local_88;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_80;
  double *local_68;
  Mat *local_60;
  Matrix<double,__1,__1,_0,__1,__1> *local_50;
  undefined8 local_48;
  Mat *local_40;
  Mat *local_38;
  
  local_90 = &this->M;
  y = &this->nInvSolFound;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_118,local_90,y);
  local_100._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b8,(int *)local_100,y);
  local_98 = (Mat *)CONCAT44(local_98._4_4_,newSol1);
  local_a0 = CONCAT44(local_a0._4_4_,newSol2);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_80,(long)this->nInvSolFound,&this->zeroZZ);
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < (long)*y + -1; lVar2 = lVar2 + 1) {
    local_100._0_8_ =
         local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         + local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows * lVar2;
    local_100._8_8_ =
         local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_e8 = &local_b8;
    local_e0.m_value = 0;
    local_d0 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
    local_d8.m_value = lVar2;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_100,
               (Matrix<double,_1,_1,_0,_1,_1> *)
               ((long)&(((this->invPredictions).
                         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         .
                         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
               lVar4));
    lVar4 = lVar4 + 8;
  }
  local_d8.m_value = (long)worseSol;
  local_100._0_8_ =
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       local_d8.m_value;
  local_100._8_8_ =
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_e0.m_value = 0;
  local_d0 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
  local_e8 = &local_b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_100,
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)local_98].super_LinearExpert<1,_1>.
              pred_z);
  local_d8.m_value = (long)this->nInvSolFound + -1;
  local_100._0_8_ =
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       local_d8.m_value;
  local_100._8_8_ =
       local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_e0.m_value = 0;
  local_d0 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
  local_e8 = &local_b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_100,
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)local_a0].super_LinearExpert<1,_1>.
              pred_z);
  local_98 = &this->invRzj;
  uVar1 = 0;
  while ((int)uVar1 < (this->param).iterMax) {
    local_a0 = uVar1;
    for (lVar2 = 0; lVar2 < *local_90; lVar2 = lVar2 + 1) {
      for (lVar4 = 0; lVar4 < *y; lVar4 = lVar4 + 1) {
        local_100._8_8_ =
             local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * lVar4;
        local_100._0_8_ =
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar2].super_LinearExpert<1,_1>.pred_z;
        local_100._16_8_ =
             local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_e0.m_value = (long)&local_b8;
        local_d8.m_value = 0;
        local_c8 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_rows;
        local_d0 = (Mat *)lVar4;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>> *)&local_68,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)local_100);
        dVar6 = exp(((double)(this->iInvRj).
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                             .
                             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar2].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
                     * (double)local_68 * (double)local_68 * -0.5) / this->sumAll);
        local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         * lVar4 + lVar2] = dVar6;
      }
      local_100._0_8_ =
           local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + lVar2;
      local_100._16_8_ =
           local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_d8.m_value = 0;
      local_d0 = (Mat *)0x1;
      local_e8 = &local_118;
      local_e0.m_value = lVar2;
      local_68 = (double *)
                 Eigen::
                 DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
                 sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)local_100);
      if (0.0 < (double)local_68) {
        local_100._0_8_ =
             local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + lVar2;
        local_100._16_8_ =
             local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        local_d8.m_value = 0;
        local_d0 = (Mat *)0x1;
        local_e8 = &local_118;
        local_e0.m_value = lVar2;
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)local_100,(Scalar *)&local_68);
      }
      lVar4 = 0;
      for (lVar3 = 0; lVar3 < *y; lVar3 = lVar3 + 1) {
        local_100._0_8_ =
             (this->iInvRj).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar2;
        local_100._16_8_ =
             local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data[local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * lVar3 + lVar2];
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,1,1,0,1,1>> *)
                   ((long)((local_80.
                            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            .
                            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
                          m_data.array + lVar4),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                    *)local_100);
        lVar4 = lVar4 + 8;
      }
    }
    for (pMVar5 = (Mat *)0x0; (long)pMVar5 < (long)*y;
        pMVar5 = (Mat *)((long)&(pMVar5->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                m_storage.m_data + 1)) {
      local_100._0_8_ =
           local_80.
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (long)pMVar5;
      local_100._16_8_ =
           local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * (long)pMVar5;
      local_100._8_8_ = local_98;
      local_e8 = (Matrix<double,__1,__1,_0,__1,__1> *)
                 local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
      local_d0 = (Mat *)0x0;
      local_68 = local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data + local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_rows * (long)pMVar5;
      local_60 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      local_48 = 0;
      local_c0 = (Matrix<double,__1,__1,_0,__1,__1> *)
                 local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
      local_38 = (Mat *)local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      local_88 = &local_68;
      local_d8.m_value = (long)&local_118;
      local_c8 = pMVar5;
      local_50 = &local_b8;
      local_40 = pMVar5;
      Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,Eigen::MatrixBase>
      ::operator=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::MatrixBase>
                   *)&local_88,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_0>_>
                   *)local_100);
      local_80.
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pMVar5].
      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = 0.0;
    }
    uVar1 = (ulong)((int)local_a0 + 1);
  }
  lVar3 = 0;
  lVar2 = 0;
  for (lVar4 = 0; lVar4 < *local_90; lVar4 = lVar4 + 1) {
    local_100._0_8_ =
         (long)local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data + lVar2;
    local_100._16_8_ =
         local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    local_d8.m_value = 0;
    local_d0 = (Mat *)0x1;
    local_e8 = &local_118;
    local_e0.m_value = lVar4;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::maxCoeff<0,int>
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)local_100,
               (int *)((long)(this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar2 = lVar2 + 8;
    lVar3 = lVar3 + 4;
  }
  free(local_80.
       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       .
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}